

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyPixels.cpp
# Opt level: O0

void testCopyPixels(string *tempDir)

{
  Array2D<Imath_3_2::half> *this;
  ostream *this_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  Array2D<Imath_3_2::half> *in_stack_00000018;
  exception *e;
  Array2D<Imath_3_2::half> ph;
  int DY;
  int DX;
  int H;
  int W;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  
  this = (Array2D<Imath_3_2::half> *)
         std::operator<<((ostream *)&std::cout,"Testing fast pixel copying");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (this,in_stack_ffffffffffffffa8,(long)in_stack_ffffffffffffffa0);
  anon_unknown.dwarf_af64a::fillPixels
            (this,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
  anon_unknown.dwarf_af64a::writeCopyRead
            ((string *)e,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
             in_stack_00000008);
  anon_unknown.dwarf_af64a::writeCopyRead
            ((string *)e,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
             in_stack_00000008);
  anon_unknown.dwarf_af64a::writeCopyRead
            ((string *)e,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
             in_stack_00000008);
  anon_unknown.dwarf_af64a::writeCopyRead
            ((string *)e,in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
             in_stack_00000008);
  this_00 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void
testCopyPixels (const std::string& tempDir)
{
    try
    {
        cout << "Testing fast pixel copying" << endl;

        const int W  = 371;
        const int H  = 559;
        const int DX = 17;
        const int DY = 29;

        Array2D<half> ph (H, W);

        fillPixels (ph, W, H);
        writeCopyRead (tempDir, ph, W, H, 0, 0);
        writeCopyRead (tempDir, ph, W, H, 0, DY);
        writeCopyRead (tempDir, ph, W, H, DX, 0);
        writeCopyRead (tempDir, ph, W, H, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}